

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::decrement(segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *this)

{
  bool bVar1;
  size_t offset;
  ulong offset_00;
  pair<unsigned_long,_unsigned_long> pos;
  
  offset = (this->current_).second;
  offset_00 = offset;
  if (this->full_select_ == true) {
    if (offset < 2) {
      if (offset == 0) {
        offset = 0;
        offset_00 = 0;
        goto LAB_00126e5c;
      }
      offset = 1;
      offset_00 = offset;
    }
    else {
      do {
        offset = offset - 1;
        bVar1 = valid_offset(this,offset);
        offset_00 = offset;
        if (bVar1) break;
      } while (1 < offset);
    }
    do {
      offset = offset - 1;
      bVar1 = valid_offset(this,offset);
      if (bVar1) break;
    } while (offset != 0);
  }
  else {
    do {
      if (offset_00 < 2) break;
      offset_00 = offset_00 - 1;
      bVar1 = valid_offset(this,offset_00);
    } while (!bVar1);
    offset = offset_00 - 1;
  }
LAB_00126e5c:
  pos.second = offset_00;
  pos.first = offset;
  update_current(this,pos);
  return;
}

Assistant:

void decrement()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second;
                            while(next.first >0) {
                                next.first--;
                                if(valid_offset(next.first))
                                    break;
                            }
                        }
                        else {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second - 1;
                        }
                        update_current(next);
                    }